

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosSystem.cpp
# Opt level: O0

char adios2::helper::BPVersion
               (string *name,Comm *comm,
               vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *transportsParameters)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  char *in_RDX;
  Comm *in_RSI;
  string mmdFileName;
  char version;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffb7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_40 [36];
  undefined3 in_stack_ffffffffffffffe4;
  int rankSource;
  
  rankSource = CONCAT13(0x34,in_stack_ffffffffffffffe4);
  iVar3 = Comm::Rank((Comm *)0x9ca322);
  if (iVar3 == 0) {
    std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7);
    std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    bVar1 = adios2sys::SystemTools::PathExists((string *)mmdFileName._0_8_);
    if (bVar1) {
      rankSource = CONCAT13(0x35,(int3)rankSource);
    }
    else {
      rankSource = CONCAT13(0x34,(int3)rankSource);
    }
    std::__cxx11::string::~string(local_40);
  }
  cVar2 = Comm::BroadcastValue<char>(in_RSI,in_RDX,rankSource);
  return cVar2;
}

Assistant:

char BPVersion(const std::string &name, helper::Comm &comm,
               const std::vector<Params> &transportsParameters) noexcept
{
    char version = '4'; // default result
    if (!comm.Rank())
    {
        std::string mmdFileName = name + PathSeparator + "mmd.0";
        if (adios2sys::SystemTools::PathExists(mmdFileName))
        {
            version = '5';
        }
        else
        {
            version = '4';
        }
    }
    version = comm.BroadcastValue(version);
    return version;
}